

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

void __thiscall
adios2::query::QueryVar::BlockIndexEvaluate
          (QueryVar *this,IO *io,Engine *reader,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *touchedBlocks)

{
  string *name;
  pointer pBVar1;
  DataType DVar2;
  pointer cpy;
  BlockIndex<signed_char> idx;
  BlockHit local_50;
  
  name = &this->m_VarName;
  DVar2 = core::IO::InquireVariableType(io,name);
  switch(DVar2) {
  case Int8:
    local_50.m_ID = (size_t)core::IO::InquireVariable<signed_char>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<signed_char>::Evaluate((BlockIndex<signed_char> *)&local_50,this,touchedBlocks);
    break;
  case Int16:
    local_50.m_ID = (size_t)core::IO::InquireVariable<short>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<short>::Evaluate((BlockIndex<short> *)&local_50,this,touchedBlocks);
    break;
  case Int32:
    local_50.m_ID = (size_t)core::IO::InquireVariable<int>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<int>::Evaluate((BlockIndex<int> *)&local_50,this,touchedBlocks);
    break;
  case Int64:
    local_50.m_ID = (size_t)core::IO::InquireVariable<long>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<long>::Evaluate((BlockIndex<long> *)&local_50,this,touchedBlocks);
    break;
  case UInt8:
    local_50.m_ID = (size_t)core::IO::InquireVariable<unsigned_char>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<unsigned_char>::Evaluate((BlockIndex<unsigned_char> *)&local_50,this,touchedBlocks);
    break;
  case UInt16:
    local_50.m_ID = (size_t)core::IO::InquireVariable<unsigned_short>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<unsigned_short>::Evaluate((BlockIndex<unsigned_short> *)&local_50,this,touchedBlocks)
    ;
    break;
  case UInt32:
    local_50.m_ID = (size_t)core::IO::InquireVariable<unsigned_int>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<unsigned_int>::Evaluate((BlockIndex<unsigned_int> *)&local_50,this,touchedBlocks);
    break;
  case UInt64:
    local_50.m_ID = (size_t)core::IO::InquireVariable<unsigned_long>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<unsigned_long>::Evaluate((BlockIndex<unsigned_long> *)&local_50,this,touchedBlocks);
    break;
  case Float:
    local_50.m_ID = (size_t)core::IO::InquireVariable<float>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<float>::Evaluate((BlockIndex<float> *)&local_50,this,touchedBlocks);
    break;
  case Double:
    local_50.m_ID = (size_t)core::IO::InquireVariable<double>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<double>::Evaluate((BlockIndex<double> *)&local_50,this,touchedBlocks);
    break;
  case LongDouble:
    local_50.m_ID = (size_t)core::IO::InquireVariable<long_double>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<long_double>::Evaluate((BlockIndex<long_double> *)&local_50,this,touchedBlocks);
    break;
  case Char:
    local_50.m_ID = (size_t)core::IO::InquireVariable<char>(io,name);
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)io;
    local_50.m_Regions.
    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)reader;
    BlockIndex<char>::Evaluate((BlockIndex<char> *)&local_50,this,touchedBlocks);
  }
  if ((touchedBlocks->
      super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>)._M_impl
      .super__Vector_impl_data._M_finish !=
      (touchedBlocks->
      super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>)._M_impl
      .super__Vector_impl_data._M_start) {
    LimitToSelection(this,touchedBlocks);
    pBVar1 = (touchedBlocks->
             super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (cpy = (touchedBlocks->
               super__Vector_base<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
               )._M_impl.super__Vector_impl_data._M_start; cpy != pBVar1; cpy = cpy + 1) {
      BlockHit::BlockHit(&local_50,cpy);
      if (local_50.m_Regions.
          super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_50.m_Regions.
          super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        QueryBase::ApplyOutputRegion(&this->super_QueryBase,&local_50.m_Regions,&this->m_Selection);
      }
      std::
      vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~vector(&local_50.m_Regions);
    }
  }
  return;
}

Assistant:

void QueryVar::BlockIndexEvaluate(adios2::core::IO &io, adios2::core::Engine &reader,
                                  std::vector<BlockHit> &touchedBlocks)
{
    const DataType varType = io.InquireVariableType(m_VarName);

    // var already exists when loading query. skipping validity checking
#define declare_type(T)                                                                            \
    if (varType == adios2::helper::GetDataType<T>())                                               \
    {                                                                                              \
        core::Variable<T> *var = io.InquireVariable<T>(m_VarName);                                 \
        BlockIndex<T> idx(var, io, reader);                                                        \
        idx.Evaluate(*this, touchedBlocks);                                                        \
    }
    // ADIOS2_FOREACH_ATTRIBUTE_TYPE_1ARG(declare_type) //skip complex types
    ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type

    if (touchedBlocks.size() > 0)
    {
        LimitToSelection(touchedBlocks);

        for (auto blk : touchedBlocks)
        {
            if (!blk.isLocalArrayBlock())
            {
                ApplyOutputRegion(blk.m_Regions, m_Selection);
            }
        }
    }
}